

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

s2textformat * __thiscall
s2textformat::ToString_abi_cxx11_
          (s2textformat *this,vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points)

{
  Vector3<double> *v;
  size_type sVar1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  v = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::data(points);
  sVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(points);
  AppendVertices(v,(int)sVar1,(string *)this);
  return this;
}

Assistant:

string ToString(const vector<S2Point>& points) {
  string out;
  AppendVertices(points.data(), points.size(), &out);
  return out;
}